

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::AddP70colorA(Node *this,string *name,double r,double g,double b)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  Node n;
  double b_local;
  double g_local;
  double r_local;
  string *name_local;
  Node *this_local;
  
  n.property_start = (size_t)b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"P",&local_c1);
  Node((Node *)local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::string((string *)&local_f8,(string *)name);
  AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,double,double,double>
            ((Node *)local_a0,&local_f8,"Color","","A",r,g,(double)n.property_start);
  std::__cxx11::string::~string((string *)&local_f8);
  AddChild(this,(Node *)local_a0);
  ~Node((Node *)local_a0);
  return;
}

Assistant:

void FBX::Node::AddP70colorA(
    const std::string& name, double r, double g, double b
) {
    FBX::Node n("P");
    n.AddProperties(name, "Color", "", "A", r, g, b);
    AddChild(n);
}